

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basics_gen.c
# Opt level: O2

gboolean greetable_call_greet_finish
                   (Greetable *proxy,guint16 *out_num_times_called,GAsyncResult *res,GError **error)

{
  undefined8 uVar1;
  long lVar2;
  
  uVar1 = g_dbus_proxy_get_type();
  uVar1 = g_type_check_instance_cast(proxy,uVar1);
  lVar2 = g_dbus_proxy_call_finish(uVar1,res,error);
  if (lVar2 != 0) {
    g_variant_get(lVar2,"(q)",out_num_times_called);
    g_variant_unref(lVar2);
  }
  return (gboolean)(lVar2 != 0);
}

Assistant:

gboolean
greetable_call_greet_finish (
    Greetable *proxy,
    guint16 *out_num_times_called,
    GAsyncResult *res,
    GError **error)
{
  GVariant *_ret;
  _ret = g_dbus_proxy_call_finish (G_DBUS_PROXY (proxy), res, error);
  if (_ret == NULL)
    goto _out;
  g_variant_get (_ret,
                 "(q)",
                 out_num_times_called);
  g_variant_unref (_ret);
_out:
  return _ret != NULL;
}